

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O0

Flow * __thiscall
wasm::Visitor<wasm::CExpressionRunner,_wasm::Flow>::visit
          (Flow *__return_storage_ptr__,Visitor<wasm::CExpressionRunner,_wasm::Flow> *this,
          Expression *curr)

{
  Expression *curr_local;
  Visitor<wasm::CExpressionRunner,_wasm::Flow> *this_local;
  
  if (curr != (Expression *)0x0) {
    switch(curr->_id) {
    case BlockId:
      ExpressionRunner<wasm::CExpressionRunner>::visitBlock
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (Block *)curr);
      break;
    case IfId:
      ExpressionRunner<wasm::CExpressionRunner>::visitIf
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,(If *)curr
                );
      break;
    case LoopId:
      ExpressionRunner<wasm::CExpressionRunner>::visitLoop
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (Loop *)curr);
      break;
    case BreakId:
      ExpressionRunner<wasm::CExpressionRunner>::visitBreak
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (Break *)curr);
      break;
    case SwitchId:
      ExpressionRunner<wasm::CExpressionRunner>::visitSwitch
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (Switch *)curr);
      break;
    case CallId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitCall
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (Call *)curr);
      break;
    case CallIndirectId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitCallIndirect
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (CallIndirect *)curr);
      break;
    case LocalGetId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitLocalGet
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (LocalGet *)curr);
      break;
    case LocalSetId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitLocalSet
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (LocalSet *)curr);
      break;
    case GlobalGetId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitGlobalGet
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (GlobalGet *)curr);
      break;
    case GlobalSetId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitGlobalSet
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (GlobalSet *)curr);
      break;
    case LoadId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitLoad
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (Load *)curr);
      break;
    case StoreId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitStore
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (Store *)curr);
      break;
    case ConstId:
      ExpressionRunner<wasm::CExpressionRunner>::visitConst
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (Const *)curr);
      break;
    case UnaryId:
      ExpressionRunner<wasm::CExpressionRunner>::visitUnary
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (Unary *)curr);
      break;
    case BinaryId:
      ExpressionRunner<wasm::CExpressionRunner>::visitBinary
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (Binary *)curr);
      break;
    case SelectId:
      ExpressionRunner<wasm::CExpressionRunner>::visitSelect
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (Select *)curr);
      break;
    case DropId:
      ExpressionRunner<wasm::CExpressionRunner>::visitDrop
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (Drop *)curr);
      break;
    case ReturnId:
      ExpressionRunner<wasm::CExpressionRunner>::visitReturn
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (Return *)curr);
      break;
    case MemorySizeId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitMemorySize
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (MemorySize *)curr);
      break;
    case MemoryGrowId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitMemoryGrow
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (MemoryGrow *)curr);
      break;
    case NopId:
      ExpressionRunner<wasm::CExpressionRunner>::visitNop
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (Nop *)curr);
      break;
    case UnreachableId:
      ExpressionRunner<wasm::CExpressionRunner>::visitUnreachable
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (Unreachable *)curr);
      break;
    case AtomicRMWId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitAtomicRMW
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (AtomicRMW *)curr);
      break;
    case AtomicCmpxchgId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitAtomicCmpxchg
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (AtomicCmpxchg *)curr);
      break;
    case AtomicWaitId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitAtomicWait
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (AtomicWait *)curr);
      break;
    case AtomicNotifyId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitAtomicNotify
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (AtomicNotify *)curr);
      break;
    case AtomicFenceId:
      ExpressionRunner<wasm::CExpressionRunner>::visitAtomicFence
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (AtomicFence *)curr);
      break;
    case SIMDExtractId:
      ExpressionRunner<wasm::CExpressionRunner>::visitSIMDExtract
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (SIMDExtract *)curr);
      break;
    case SIMDReplaceId:
      ExpressionRunner<wasm::CExpressionRunner>::visitSIMDReplace
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (SIMDReplace *)curr);
      break;
    case SIMDShuffleId:
      ExpressionRunner<wasm::CExpressionRunner>::visitSIMDShuffle
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (SIMDShuffle *)curr);
      break;
    case SIMDTernaryId:
      ExpressionRunner<wasm::CExpressionRunner>::visitSIMDTernary
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (SIMDTernary *)curr);
      break;
    case SIMDShiftId:
      ExpressionRunner<wasm::CExpressionRunner>::visitSIMDShift
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (SIMDShift *)curr);
      break;
    case SIMDLoadId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitSIMDLoad
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (SIMDLoad *)curr);
      break;
    case SIMDLoadStoreLaneId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitSIMDLoadStoreLane
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (SIMDLoadStoreLane *)curr);
      break;
    case MemoryInitId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitMemoryInit
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (MemoryInit *)curr);
      break;
    case DataDropId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitDataDrop
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (DataDrop *)curr);
      break;
    case MemoryCopyId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitMemoryCopy
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (MemoryCopy *)curr);
      break;
    case MemoryFillId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitMemoryFill
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (MemoryFill *)curr);
      break;
    case PopId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitPop
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (Pop *)curr);
      break;
    case RefNullId:
      ExpressionRunner<wasm::CExpressionRunner>::visitRefNull
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (RefNull *)curr);
      break;
    case RefIsNullId:
      ExpressionRunner<wasm::CExpressionRunner>::visitRefIsNull
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (RefIsNull *)curr);
      break;
    case RefFuncId:
      ExpressionRunner<wasm::CExpressionRunner>::visitRefFunc
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (RefFunc *)curr);
      break;
    case RefEqId:
      ExpressionRunner<wasm::CExpressionRunner>::visitRefEq
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (RefEq *)curr);
      break;
    case TableGetId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitTableGet
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (TableGet *)curr);
      break;
    case TableSetId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitTableSet
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (TableSet *)curr);
      break;
    case TableSizeId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitTableSize
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (TableSize *)curr);
      break;
    case TableGrowId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitTableGrow
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (TableGrow *)curr);
      break;
    case TableFillId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitTableFill
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (TableFill *)curr);
      break;
    case TableCopyId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitTableCopy
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (TableCopy *)curr);
      break;
    case TableInitId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitTableInit
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (TableInit *)curr);
      break;
    case TryId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitTry
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (Try *)curr);
      break;
    case TryTableId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitTryTable
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (TryTable *)curr);
      break;
    case ThrowId:
      ExpressionRunner<wasm::CExpressionRunner>::visitThrow
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (Throw *)curr);
      break;
    case RethrowId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitRethrow
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (Rethrow *)curr);
      break;
    case ThrowRefId:
      ExpressionRunner<wasm::CExpressionRunner>::visitThrowRef
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (ThrowRef *)curr);
      break;
    case TupleMakeId:
      ExpressionRunner<wasm::CExpressionRunner>::visitTupleMake
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (TupleMake *)curr);
      break;
    case TupleExtractId:
      ExpressionRunner<wasm::CExpressionRunner>::visitTupleExtract
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (TupleExtract *)curr);
      break;
    case RefI31Id:
      ExpressionRunner<wasm::CExpressionRunner>::visitRefI31
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (RefI31 *)curr);
      break;
    case I31GetId:
      ExpressionRunner<wasm::CExpressionRunner>::visitI31Get
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (I31Get *)curr);
      break;
    case CallRefId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitCallRef
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (CallRef *)curr);
      break;
    case RefTestId:
      ExpressionRunner<wasm::CExpressionRunner>::visitRefTest
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (RefTest *)curr);
      break;
    case RefCastId:
      ExpressionRunner<wasm::CExpressionRunner>::visitRefCast
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (RefCast *)curr);
      break;
    case BrOnId:
      ExpressionRunner<wasm::CExpressionRunner>::visitBrOn
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (BrOn *)curr);
      break;
    case StructNewId:
      ExpressionRunner<wasm::CExpressionRunner>::visitStructNew
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (StructNew *)curr);
      break;
    case StructGetId:
      ExpressionRunner<wasm::CExpressionRunner>::visitStructGet
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (StructGet *)curr);
      break;
    case StructSetId:
      ExpressionRunner<wasm::CExpressionRunner>::visitStructSet
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (StructSet *)curr);
      break;
    case StructRMWId:
      ExpressionRunner<wasm::CExpressionRunner>::visitStructRMW
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (StructRMW *)curr);
      break;
    case StructCmpxchgId:
      ExpressionRunner<wasm::CExpressionRunner>::visitStructCmpxchg
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (StructCmpxchg *)curr);
      break;
    case ArrayNewId:
      ExpressionRunner<wasm::CExpressionRunner>::visitArrayNew
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (ArrayNew *)curr);
      break;
    case ArrayNewDataId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitArrayNewData
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (ArrayNewData *)curr);
      break;
    case ArrayNewElemId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitArrayNewElem
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (ArrayNewElem *)curr);
      break;
    case ArrayNewFixedId:
      ExpressionRunner<wasm::CExpressionRunner>::visitArrayNewFixed
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (ArrayNewFixed *)curr);
      break;
    case ArrayGetId:
      ExpressionRunner<wasm::CExpressionRunner>::visitArrayGet
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (ArrayGet *)curr);
      break;
    case ArraySetId:
      ExpressionRunner<wasm::CExpressionRunner>::visitArraySet
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (ArraySet *)curr);
      break;
    case ArrayLenId:
      ExpressionRunner<wasm::CExpressionRunner>::visitArrayLen
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (ArrayLen *)curr);
      break;
    case ArrayCopyId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitArrayCopy
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (ArrayCopy *)curr);
      break;
    case ArrayFillId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitArrayFill
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (ArrayFill *)curr);
      break;
    case ArrayInitDataId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitArrayInitData
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (ArrayInitData *)curr);
      break;
    case ArrayInitElemId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitArrayInitElem
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (ArrayInitElem *)curr);
      break;
    case RefAsId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitRefAs
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (RefAs *)curr);
      break;
    case StringNewId:
      ExpressionRunner<wasm::CExpressionRunner>::visitStringNew
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (StringNew *)curr);
      break;
    case StringConstId:
      ExpressionRunner<wasm::CExpressionRunner>::visitStringConst
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (StringConst *)curr);
      break;
    case StringMeasureId:
      ExpressionRunner<wasm::CExpressionRunner>::visitStringMeasure
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (StringMeasure *)curr);
      break;
    case StringEncodeId:
      ExpressionRunner<wasm::CExpressionRunner>::visitStringEncode
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (StringEncode *)curr);
      break;
    case StringConcatId:
      ExpressionRunner<wasm::CExpressionRunner>::visitStringConcat
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (StringConcat *)curr);
      break;
    case StringEqId:
      ExpressionRunner<wasm::CExpressionRunner>::visitStringEq
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (StringEq *)curr);
      break;
    case StringWTF16GetId:
      ExpressionRunner<wasm::CExpressionRunner>::visitStringWTF16Get
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (StringWTF16Get *)curr);
      break;
    case StringSliceWTFId:
      ExpressionRunner<wasm::CExpressionRunner>::visitStringSliceWTF
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (StringSliceWTF *)curr);
      break;
    case ContNewId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitContNew
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (ContNew *)curr);
      break;
    case ContBindId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitContBind
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (ContBind *)curr);
      break;
    case SuspendId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitSuspend
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (Suspend *)curr);
      break;
    case ResumeId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitResume
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (Resume *)curr);
      break;
    case ResumeThrowId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitResumeThrow
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (ResumeThrow *)curr);
      break;
    case StackSwitchId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitStackSwitch
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (StackSwitch *)curr);
      break;
    default:
      handle_unreachable("unexpected expression type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                         ,0x46);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("curr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                ,0x3b,
                "ReturnType wasm::Visitor<wasm::CExpressionRunner, wasm::Flow>::visit(Expression *) [SubType = wasm::CExpressionRunner, ReturnType = wasm::Flow]"
               );
}

Assistant:

ReturnType visit(Expression* curr) {
    assert(curr);

    switch (curr->_id) {
#define DELEGATE(CLASS_TO_VISIT)                                               \
  case Expression::Id::CLASS_TO_VISIT##Id:                                     \
    return static_cast<SubType*>(this)->visit##CLASS_TO_VISIT(                 \
      static_cast<CLASS_TO_VISIT*>(curr))

#include "wasm-delegations.def"

      default:
        WASM_UNREACHABLE("unexpected expression type");
    }
  }